

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sign_pss.c
# Opt level: O0

int main(int argc,char **argv)

{
  size_t custom;
  uint uVar1;
  int iVar2;
  size_t sVar3;
  mbedtls_rsa_context *ctx;
  mbedtls_md_info_t *md_info;
  FILE *__s;
  size_t local_bc8;
  size_t olen;
  char *pers;
  char filename [512];
  uchar buf [1024];
  uchar hash [32];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_pk_context pk;
  int exit_code;
  int ret;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  pk.pk_ctx._0_4_ = 1;
  olen = (size_t)anon_var_dwarf_23;
  local_bc8 = 0;
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  mbedtls_pk_init((mbedtls_pk_context *)&entropy.source[0x13].strong);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)(hash + 0x18));
  if (argc == 3) {
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    custom = olen;
    sVar3 = strlen((char *)olen);
    uVar1 = mbedtls_ctr_drbg_seed
                      ((mbedtls_ctr_drbg_context *)(hash + 0x18),mbedtls_entropy_func,
                       &ctr_drbg.p_entropy,(uchar *)custom,sVar3);
    if (uVar1 == 0) {
      printf("\n  . Reading private key from \'%s\'",argv[1]);
      fflush(_stdout);
      uVar1 = mbedtls_pk_parse_keyfile
                        ((mbedtls_pk_context *)&entropy.source[0x13].strong,argv[1],
                         anon_var_dwarf_fa82 + 9);
      if (uVar1 == 0) {
        iVar2 = mbedtls_pk_can_do((mbedtls_pk_context *)&entropy.source[0x13].strong,MBEDTLS_PK_RSA)
        ;
        if (iVar2 == 0) {
          printf(" failed\n  ! Key is not an RSA key\n");
        }
        else {
          ctx = mbedtls_pk_rsa(stack0xffffffffffffffc8);
          mbedtls_rsa_set_padding(ctx,1,6);
          printf("\n  . Generating the RSA/SHA-256 signature");
          fflush(_stdout);
          md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
          iVar2 = mbedtls_md_file(md_info,argv[2],buf + 0x3f8);
          if (iVar2 == 0) {
            uVar1 = mbedtls_pk_sign((mbedtls_pk_context *)&entropy.source[0x13].strong,
                                    MBEDTLS_MD_SHA256,buf + 0x3f8,0,(uchar *)(filename + 0x1f8),
                                    &local_bc8,mbedtls_ctr_drbg_random,hash + 0x18);
            if (uVar1 == 0) {
              snprintf((char *)&pers,0x200,"%s.sig",argv[2]);
              __s = fopen((char *)&pers,"wb+");
              if (__s == (FILE *)0x0) {
                printf(" failed\n  ! Could not create %s\n\n",&pers);
              }
              else {
                sVar3 = fwrite(filename + 0x1f8,1,local_bc8,__s);
                if (sVar3 == local_bc8) {
                  fclose(__s);
                  printf("\n  . Done (created \"%s\")\n\n",&pers);
                  pk.pk_ctx._0_4_ = 0;
                }
                else {
                  printf("failed\n  ! fwrite failed\n\n");
                  fclose(__s);
                }
              }
            }
            else {
              printf(" failed\n  ! mbedtls_pk_sign returned %d\n\n",(ulong)uVar1);
            }
          }
          else {
            printf(" failed\n  ! Could not open or read %s\n\n",argv[2]);
          }
        }
      }
      else {
        printf(" failed\n  ! Could not read key from \'%s\'\n",argv[1]);
        printf("  ! mbedtls_pk_parse_public_keyfile returned %d\n\n",(ulong)uVar1);
      }
    }
    else {
      printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)uVar1);
    }
  }
  else {
    printf("usage: rsa_sign_pss <key_file> <filename>\n");
  }
  mbedtls_pk_free((mbedtls_pk_context *)&entropy.source[0x13].strong);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)(hash + 0x18));
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  return (int)pk.pk_ctx;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_pk_context pk;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char hash[32];
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    char filename[512];
    const char *pers = "rsa_sign_pss";
    size_t olen = 0;

    mbedtls_entropy_init( &entropy );
    mbedtls_pk_init( &pk );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    if( argc != 3 )
    {
        mbedtls_printf( "usage: rsa_sign_pss <key_file> <filename>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading private key from '%s'", argv[1] );
    fflush( stdout );

    if( ( ret = mbedtls_pk_parse_keyfile( &pk, argv[1], "" ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not read key from '%s'\n", argv[1] );
        mbedtls_printf( "  ! mbedtls_pk_parse_public_keyfile returned %d\n\n", ret );
        goto exit;
    }

    if( !mbedtls_pk_can_do( &pk, MBEDTLS_PK_RSA ) )
    {
        mbedtls_printf( " failed\n  ! Key is not an RSA key\n" );
        goto exit;
    }

    mbedtls_rsa_set_padding( mbedtls_pk_rsa( pk ), MBEDTLS_RSA_PKCS_V21, MBEDTLS_MD_SHA256 );

    /*
     * Compute the SHA-256 hash of the input file,
     * then calculate the RSA signature of the hash.
     */
    mbedtls_printf( "\n  . Generating the RSA/SHA-256 signature" );
    fflush( stdout );

    if( ( ret = mbedtls_md_file(
                    mbedtls_md_info_from_type( MBEDTLS_MD_SHA256 ),
                    argv[2], hash ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! Could not open or read %s\n\n", argv[2] );
        goto exit;
    }

    if( ( ret = mbedtls_pk_sign( &pk, MBEDTLS_MD_SHA256, hash, 0, buf, &olen,
                         mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_sign returned %d\n\n", ret );
        goto exit;
    }

    /*
     * Write the signature into <filename>.sig
     */
    mbedtls_snprintf( filename, 512, "%s.sig", argv[2] );

    if( ( f = fopen( filename, "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", filename );
        goto exit;
    }

    if( fwrite( buf, 1, olen, f ) != olen )
    {
        mbedtls_printf( "failed\n  ! fwrite failed\n\n" );
        fclose( f );
        goto exit;
    }

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", filename );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    mbedtls_pk_free( &pk );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}